

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLIViewController.cpp
# Opt level: O0

void __thiscall CLIViewController::showResult(CLIViewController *this,bool win)

{
  ostream *poVar1;
  bool win_local;
  CLIViewController *this_local;
  
  if (win) {
    std::operator<<((ostream *)&std::cout,"-=Congraduations ! You Win=-");
  }
  else {
    std::operator<<((ostream *)&std::cout,"Game Over");
  }
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  showScore(this);
  poVar1 = std::operator<<((ostream *)&std::cout,"Left : Restart");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1," Right : Exit");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void CLIViewController::showResult(bool win) {
	using namespace std;
	if (win) {
		cout << "-=Congraduations ! You Win=-";
	}
	else {
		cout << "Game Over";
	}
	cout << endl << endl << endl;
	showScore();
	cout << "Left : Restart" << endl << " Right : Exit" << endl;
}